

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O2

void __thiscall deqp::gls::BeforeDrawValidator::beforeDrawCall(BeforeDrawValidator *this)

{
  GLenum GVar1;
  long lVar2;
  TestError *this_00;
  value_type local_31;
  GLint infoLogLength;
  GLint bytesWritten;
  vector<char,_std::allocator<char>_> logBuffer;
  
  bytesWritten = 0;
  logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (this->m_targetType == TARGETTYPE_PROGRAM) {
    lVar2 = 0x1690;
LAB_006b71c3:
    (**(code **)((long)&this->m_gl->activeShaderProgram + lVar2))(this->m_target);
  }
  else if (this->m_targetType == TARGETTYPE_PIPELINE) {
    lVar2 = 0x1698;
    goto LAB_006b71c3;
  }
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"validate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
                  ,0x28f);
  this->m_validateStatus = -1;
  if (this->m_targetType == TARGETTYPE_PROGRAM) {
    lVar2 = 0x9d8;
LAB_006b7211:
    (**(code **)((long)&this->m_gl->activeShaderProgram + lVar2))
              (this->m_target,0x8b83,&this->m_validateStatus);
  }
  else if (this->m_targetType == TARGETTYPE_PIPELINE) {
    lVar2 = 0x9a0;
    goto LAB_006b7211;
  }
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"get validate status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
                  ,0x29b);
  if (1 < (uint)this->m_validateStatus) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"m_validateStatus == GL_TRUE || m_validateStatus == GL_FALSE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
               ,0x29c);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  infoLogLength = 0;
  if (this->m_targetType == TARGETTYPE_PROGRAM) {
    lVar2 = 0x9d8;
LAB_006b726e:
    (**(code **)((long)&this->m_gl->activeShaderProgram + lVar2))
              (this->m_target,0x8b84,&infoLogLength);
  }
  else if (this->m_targetType == TARGETTYPE_PIPELINE) {
    lVar2 = 0x9a0;
    goto LAB_006b726e;
  }
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"get info log length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
                  ,0x2a9);
  if (infoLogLength < 1) {
    (this->m_logMessage)._M_string_length = 0;
    *(this->m_logMessage)._M_dataplus._M_p = '\0';
    goto LAB_006b7334;
  }
  local_31 = '0';
  std::vector<char,_std::allocator<char>_>::resize(&logBuffer,(long)(infoLogLength + 2),&local_31);
  if (this->m_targetType == TARGETTYPE_PROGRAM) {
    lVar2 = 0x988;
LAB_006b72ec:
    (**(code **)((long)&this->m_gl->activeShaderProgram + lVar2))
              (this->m_target,infoLogLength + 1,&bytesWritten,
               logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  else if (this->m_targetType == TARGETTYPE_PIPELINE) {
    lVar2 = 0x998;
    goto LAB_006b72ec;
  }
  local_31 = '0';
  std::
  __find_if<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
            (logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::__cxx11::string::assign
            ((char *)&this->m_logMessage,
             (ulong)logBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
LAB_006b7334:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&logBuffer.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void BeforeDrawValidator::beforeDrawCall (void)
{
	glw::GLint					bytesWritten	= 0;
	glw::GLint					infoLogLength;
	std::vector<glw::GLchar>	logBuffer;
	int							stringLength;

	// validate
	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.validateProgram(m_target);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.validateProgramPipeline(m_target);
	else
		DE_ASSERT(false);

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "validate");

	// check status
	m_validateStatus = -1;

	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.getProgramiv(m_target, GL_VALIDATE_STATUS, &m_validateStatus);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.getProgramPipelineiv(m_target, GL_VALIDATE_STATUS, &m_validateStatus);
	else
		DE_ASSERT(false);

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "get validate status");
	TCU_CHECK(m_validateStatus == GL_TRUE || m_validateStatus == GL_FALSE);

	// read log

	infoLogLength = 0;

	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.getProgramiv(m_target, GL_INFO_LOG_LENGTH, &infoLogLength);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.getProgramPipelineiv(m_target, GL_INFO_LOG_LENGTH, &infoLogLength);
	else
		DE_ASSERT(false);

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "get info log length");

	if (infoLogLength <= 0)
	{
		m_logMessage.clear();
		return;
	}

	logBuffer.resize(infoLogLength + 2, '0'); // +1 for zero terminator (infoLogLength should include it, but better play it safe), +1 to make sure buffer is always larger

	if (m_targetType == TARGETTYPE_PROGRAM)
		m_gl.getProgramInfoLog(m_target, infoLogLength + 1, &bytesWritten, &logBuffer[0]);
	else if (m_targetType == TARGETTYPE_PIPELINE)
		m_gl.getProgramPipelineInfoLog(m_target, infoLogLength + 1, &bytesWritten, &logBuffer[0]);
	else
		DE_ASSERT(false);

	// just ignore bytesWritten to be safe, find the null terminator
	stringLength = (int)(std::find(logBuffer.begin(), logBuffer.end(), '0') - logBuffer.begin());
	m_logMessage.assign(&logBuffer[0], stringLength);
}